

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O2

int64_t get_coeff_dist(tran_low_t tcoeff,tran_low_t dqcoeff,int shift,qm_val_t *qmatrix,
                      int coeff_idx)

{
  long lVar1;
  
  lVar1 = (long)(tcoeff - dqcoeff << ((byte)shift & 0x1f));
  if (qmatrix != (qm_val_t *)0x0) {
    return (ulong)qmatrix[coeff_idx] * lVar1 * (ulong)qmatrix[coeff_idx] * lVar1 + 0x200 >> 10;
  }
  return lVar1 * lVar1;
}

Assistant:

static inline int64_t get_coeff_dist(tran_low_t tcoeff, tran_low_t dqcoeff,
                                     int shift, const qm_val_t *qmatrix,
                                     int coeff_idx) {
  int64_t diff = (tcoeff - dqcoeff) * (1 << shift);
  if (qmatrix == NULL) {
    return diff * diff;
  }
  // When AOM_DIST_METRIC_QM_PSNR is enabled, this mirrors the rate-distortion
  // computation done in av1_block_error_qm, improving visual quality.
  // The maximum value of `shift` is 2, `tcoeff` and `dqcoeff` are at most 22
  // bits, and AOM_QM_BITS is 5, so `diff` should fit in 29-bits. The
  // multiplication `diff * diff` then does not risk overflowing.
  diff *= qmatrix[coeff_idx];
  const int64_t error =
      (diff * diff + (1 << (2 * AOM_QM_BITS - 1))) >> (2 * AOM_QM_BITS);
  return error;
}